

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInfo.Common.cpp
# Opt level: O1

bool PlatformAgnostic::SystemInfo::GetBinaryLocation(char16 *path,uint size)

{
  short sVar1;
  LPCUTF8 puVar2;
  uint uVar3;
  LPCUTF8 __buf;
  ssize_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  LPCUTF8 local_38;
  char *tmp;
  
  __buf = (LPCUTF8)malloc((long)(int)(size * 3));
  local_38 = __buf;
  sVar4 = readlink("/proc/self/exe",(char *)__buf,(ulong)(size * 3 - 1));
  puVar2 = local_38;
  uVar3 = (uint)sVar4;
  if ((int)uVar3 < 1) {
    builtin_memcpy(__buf,"GetBinaryLocation: /proc/self/exe has failed.",0x2d);
    uVar7 = 0x2d;
  }
  else {
    uVar7 = (ulong)(uVar3 & 0x7fffffff);
  }
  __buf[uVar7] = '\0';
  if ((int)uVar3 < 1) {
    free(local_38);
  }
  else {
    sVar5 = strlen((char *)local_38);
    sVar6 = utf8::DecodeUnitsIntoAndNullTerminate
                      (path,&local_38,puVar2 + sVar5,doDefault,(bool *)0x0);
    free(local_38);
    if (sVar6 != 0) {
      return true;
    }
    if (size != 0 && path != (char16 *)0x0) {
      uVar8 = (ulong)size;
      lVar9 = 0;
      uVar7 = uVar8;
      do {
        sVar1 = *(short *)((long)L"GetBinaryLocation: DecodeUnitsIntoAndNullTerminate has failed." +
                          lVar9);
        *(short *)((long)path + lVar9) = sVar1;
        if (sVar1 == 0) goto LAB_00155e20;
        lVar9 = lVar9 + 2;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      uVar7 = 0;
LAB_00155e20:
      if (uVar7 != 0) {
        uVar7 = (uVar8 - uVar7) + 1;
        if (uVar8 < uVar7 || uVar8 - uVar7 == 0) {
          return false;
        }
        memset(path + uVar7,0xfd,(uVar8 - uVar7) * 2);
        return false;
      }
      *path = L'\0';
      if (1 < size) {
        memset(path + 1,0xfd,uVar8 * 2 - 2);
      }
    }
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  return false;
}

Assistant:

bool SystemInfo::GetBinaryLocation(char16 *path, const unsigned size)
    {
        int tmp_size = size * 3;
        char *tmp = (char*)malloc(tmp_size);
        if (!GetBinaryLocation(tmp, tmp_size))
        {
            free(tmp);
            return false;
        }
        if (utf8::DecodeUnitsIntoAndNullTerminate(path, (LPCUTF8&)tmp, (LPCUTF8)tmp + strlen(tmp)) <= 0)
        {
            free(tmp);
            wcscpy_s(path, size, _u("GetBinaryLocation: DecodeUnitsIntoAndNullTerminate has failed."));
            return false;
        }
        free(tmp);
        return true;
    }